

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_ManSimRelCollectOutputs
              (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsOut,Vec_Wrd_t *vSimsOut,
              Vec_Wrd_t *vRel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *p_00;
  int local_4c;
  uint local_48;
  int CountMints;
  int Count;
  int nMints;
  int m;
  int i;
  Vec_Wrd_t *vRel_local;
  Vec_Wrd_t *vSimsOut_local;
  int nWordsOut_local;
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  iVar1 = nWords / nWordsOut;
  local_48 = 0;
  iVar2 = Vec_WrdSize(vSims);
  iVar3 = Gia_ManObjNum(p);
  if (iVar2 != nWords * iVar3) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2b8,
                  "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  iVar2 = Vec_WrdSize(vSimsOut);
  iVar3 = Gia_ManCoNum(p);
  if (iVar2 == nWordsOut * iVar3) {
    iVar2 = Vec_WrdSize(vRel);
    if (iVar2 == nWordsOut * iVar1) {
      for (nMints = 0; nMints < nWordsOut * 0x40; nMints = nMints + 1) {
        local_4c = 0;
        for (Count = 0; Count < iVar1; Count = Count + 1) {
          iVar2 = Gia_ManSimRelCompare(p,nWords,vSims,nWordsOut,vSimsOut,nMints,Count);
          if (iVar2 != 0) {
            p_00 = Vec_WrdArray(vRel);
            Abc_TtSetBit(p_00,nMints * iVar1 + Count);
            local_4c = local_4c + 1;
          }
        }
        local_48 = (local_4c == 0) + local_48;
      }
      if (local_48 != 0) {
        printf("The relation is not well-defined for %d (out of %d) patterns.\n",(ulong)local_48,
               (ulong)(uint)(nWordsOut << 6));
      }
      return local_48;
    }
    __assert_fail("Vec_WrdSize(vRel) == nWordsOut * nMints",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2ba,
                  "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  __assert_fail("Vec_WrdSize(vSimsOut) == nWordsOut * Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x2b9,
                "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
               );
}

Assistant:

int Gia_ManSimRelCollectOutputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsOut, Vec_Wrd_t * vSimsOut, Vec_Wrd_t * vRel )
{
    int i, m, nMints = nWords / nWordsOut, Count = 0;
    assert( Vec_WrdSize(vSims)    == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsOut) == nWordsOut * Gia_ManCoNum(p) );
    assert( Vec_WrdSize(vRel)     == nWordsOut * nMints );
    for ( i = 0; i < 64 * nWordsOut; i++ )
    {
        int CountMints = 0;
        for ( m = 0; m < nMints; m++ )
            if ( Gia_ManSimRelCompare(p, nWords, vSims, nWordsOut, vSimsOut, i, m) )
                Abc_TtSetBit( Vec_WrdArray(vRel), i*nMints+m ), CountMints++;
        Count += CountMints == 0;
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWordsOut );
    return Count;
}